

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

Vec_Mem_t * Vec_MemAllocForTT(int nVars,int fCompl)

{
  int iVar1;
  int iVar2;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar3;
  
  iVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar2 = 1;
  }
  pEntry = (word *)calloc(1,(long)iVar2 * 8);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar2;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  iVar1 = Abc_PrimeCudd(10000);
  pVVar3 = Vec_IntStartFull(iVar1);
  p->vTable = pVVar3;
  pVVar3 = Vec_IntAlloc(10000);
  p->vNexts = pVVar3;
  iVar1 = Vec_MemHashInsert(p,pEntry);
  if (iVar1 == 0) {
    memset(pEntry,0xaa,(long)iVar2 * 8);
    iVar2 = Vec_MemHashInsert(p,pEntry);
    if (iVar2 == 1) {
      free(pEntry);
      return p;
    }
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  __assert_fail("Value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
}

Assistant:

static inline Vec_Mem_t * Vec_MemAllocForTT( int nVars, int fCompl )
{
    int Value, nWords = (nVars <= 6 ? 1 : (1 << (nVars - 6)));
    word * uTruth = ABC_ALLOC( word, nWords ); 
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    memset( uTruth, 0x00, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 0 );
    if ( fCompl )
        memset( uTruth, 0x55, sizeof(word) * nWords );
    else
        memset( uTruth, 0xAA, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 1 );
    ABC_FREE( uTruth );
    return vTtMem;
}